

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_write_header(p_ply ply)

{
  int iVar1;
  p_ply_element_conflict ptVar2;
  p_ply_property_conflict ptVar3;
  p_ply_property_conflict property;
  p_ply_element_conflict element;
  long j;
  long i;
  p_ply ply_local;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_WRITE)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25d,"int ply_write_header(p_ply)");
  }
  if ((ply->element == (p_ply_element_conflict)0x0) && (ply->nelements != 0)) {
    __assert_fail("ply->element || ply->nelements == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25e,"int ply_write_header(p_ply)");
  }
  if ((ply->element != (p_ply_element_conflict)0x0) && (ply->nelements < 1)) {
    __assert_fail("!ply->element || ply->nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25f,"int ply_write_header(p_ply)");
  }
  iVar1 = fprintf((FILE *)ply->fp,"ply\nformat %s 1.0\n",ply_storage_mode_list[ply->storage_mode]);
  if (iVar1 < 1) {
LAB_001675b4:
    ply_ferror(ply,"Error writing to file");
    ply_local._4_4_ = 0;
  }
  else {
    for (j = 0; j < ply->ncomments; j = j + 1) {
      iVar1 = fprintf((FILE *)ply->fp,"comment %s\n",ply->comment + j * 0x400);
      if (iVar1 < 1) goto LAB_001675b4;
    }
    for (j = 0; j < ply->nobj_infos; j = j + 1) {
      iVar1 = fprintf((FILE *)ply->fp,"obj_info %s\n",ply->obj_info + j * 0x400);
      if (iVar1 < 1) goto LAB_001675b4;
    }
    for (j = 0; j < ply->nelements; j = j + 1) {
      ptVar2 = ply->element + j;
      if ((ptVar2->property == (p_ply_property_conflict)0x0) && (ptVar2->nproperties != 0)) {
        __assert_fail("element->property || element->nproperties == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                      ,0x26a,"int ply_write_header(p_ply)");
      }
      if ((ptVar2->property != (p_ply_property_conflict)0x0) && (ptVar2->nproperties < 1)) {
        __assert_fail("!element->property || element->nproperties > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                      ,0x26b,"int ply_write_header(p_ply)");
      }
      iVar1 = fprintf((FILE *)ply->fp,"element %s %ld\n",ptVar2,ptVar2->ninstances);
      if (iVar1 < 1) goto LAB_001675b4;
      for (element = (p_ply_element_conflict)0x0; (long)element < ptVar2->nproperties;
          element = (p_ply_element_conflict)(element->name + 1)) {
        ptVar3 = ptVar2->property + (long)element;
        if (ptVar3->type == PLY_LIST) {
          iVar1 = fprintf((FILE *)ply->fp,"property list %s %s %s\n",
                          ply_type_list[ptVar3->length_type],ply_type_list[ptVar3->value_type],
                          ptVar3);
        }
        else {
          iVar1 = fprintf((FILE *)ply->fp,"property %s %s\n",ply_type_list[ptVar3->type],ptVar3);
        }
        if (iVar1 < 1) goto LAB_001675b4;
      }
    }
    iVar1 = fprintf((FILE *)ply->fp,"end_header\n");
    ply_local._4_4_ = (uint)(0 < iVar1);
  }
  return ply_local._4_4_;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0) goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0) goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0) goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type],
                            property->name) <= 0) goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}